

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterSeekInit(Fts5Index *p,u8 *pTerm,int nTerm,int flags,Fts5StructureSegment *pSeg,
                        Fts5SegIter *pIter)

{
  uint uVar1;
  int iVar2;
  sqlite3_stmt *p_00;
  uint in_ECX;
  undefined4 in_EDX;
  Fts5SegIter *in_RSI;
  Fts5Index *in_RDI;
  Fts5StructureSegment *in_R8;
  Fts5SegIter *in_R9;
  i64 val;
  sqlite3_stmt *pIdxSelect;
  int bDlidx;
  int bGe;
  int iPg;
  long in_stack_ffffffffffffffb8;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  int iVar4;
  
  iVar4 = 1;
  uVar1 = in_ECX & 8;
  uVar3 = 0;
  memset(in_R9,0,0x80);
  in_R9->pSeg = in_R8;
  p_00 = fts5IdxSelectStmt((Fts5Index *)CONCAT44(iVar4,uVar1));
  if (in_RDI->rc == 0) {
    sqlite3_bind_int(p_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                     (int)in_stack_ffffffffffffffb8);
    sqlite3_bind_blob((sqlite3_stmt *)CONCAT44(iVar4,uVar1),uVar3,p_00,
                      (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                      (_func_void_void_ptr *)0x277854);
    iVar2 = sqlite3_step((sqlite3_stmt *)CONCAT44(in_EDX,in_ECX));
    if (iVar2 == 100) {
      uVar3 = sqlite3_column_int(p_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      in_stack_ffffffffffffffb8 = (long)(int)uVar3;
      iVar4 = (int)(in_stack_ffffffffffffffb8 >> 1);
      uVar3 = uVar3 & 1;
    }
    i = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    iVar2 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar4,uVar1));
    in_RDI->rc = iVar2;
    sqlite3_bind_null(p_00,i);
    if (iVar4 < in_R8->pgnoFirst) {
      iVar4 = in_R8->pgnoFirst;
      uVar3 = 0;
    }
    in_R9->iLeafPgno = iVar4 + -1;
    fts5SegIterNextPage((Fts5Index *)CONCAT44(iVar4,uVar1),
                        (Fts5SegIter *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    if (in_R9->pLeaf != (Fts5Data *)0x0) {
      fts5LeafSeek((Fts5Index *)val,(int)((ulong)in_RDI >> 0x20),in_RSI,
                   (u8 *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20));
    }
    if ((in_RDI->rc == 0) &&
       (((uVar1 == 0 || ((in_ECX & 0x100) != 0)) &&
        (in_R9->flags = in_R9->flags | 1, in_R9->pLeaf != (Fts5Data *)0x0)))) {
      if ((in_ECX & 2) != 0) {
        in_R9->flags = in_R9->flags | 2;
      }
      if (uVar3 != 0) {
        fts5SegIterLoadDlidx
                  ((Fts5Index *)CONCAT44(iVar4,uVar1),
                   (Fts5SegIter *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
      }
      if ((in_ECX & 2) != 0) {
        fts5SegIterReverse((Fts5Index *)pIter,_bGe);
      }
    }
    fts5SegIterSetNext(in_RDI,in_R9);
    if ((in_ECX & 0x100) == 0) {
      fts5SegIterAllocTombstone
                ((Fts5Index *)CONCAT44(iVar4,uVar1),
                 (Fts5SegIter *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

static void fts5SegIterSeekInit(
  Fts5Index *p,                   /* FTS5 backend */
  const u8 *pTerm, int nTerm,     /* Term to seek to */
  int flags,                      /* Mask of FTS5INDEX_XXX flags */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  int iPg = 1;
  int bGe = (flags & FTS5INDEX_QUERY_SCAN);
  int bDlidx = 0;                 /* True if there is a doclist-index */
  sqlite3_stmt *pIdxSelect = 0;

  assert( bGe==0 || (flags & FTS5INDEX_QUERY_DESC)==0 );
  assert( pTerm && nTerm );
  memset(pIter, 0, sizeof(*pIter));
  pIter->pSeg = pSeg;

  /* This block sets stack variable iPg to the leaf page number that may
  ** contain term (pTerm/nTerm), if it is present in the segment. */
  pIdxSelect = fts5IdxSelectStmt(p);
  if( p->rc ) return;
  sqlite3_bind_int(pIdxSelect, 1, pSeg->iSegid);
  sqlite3_bind_blob(pIdxSelect, 2, pTerm, nTerm, SQLITE_STATIC);
  if( SQLITE_ROW==sqlite3_step(pIdxSelect) ){
    i64 val = sqlite3_column_int(pIdxSelect, 0);
    iPg = (int)(val>>1);
    bDlidx = (val & 0x0001);
  }
  p->rc = sqlite3_reset(pIdxSelect);
  sqlite3_bind_null(pIdxSelect, 2);

  if( iPg<pSeg->pgnoFirst ){
    iPg = pSeg->pgnoFirst;
    bDlidx = 0;
  }

  pIter->iLeafPgno = iPg - 1;
  fts5SegIterNextPage(p, pIter);

  if( pIter->pLeaf ){
    fts5LeafSeek(p, bGe, pIter, pTerm, nTerm);
  }

  if( p->rc==SQLITE_OK && (bGe==0 || (flags & FTS5INDEX_QUERY_SCANONETERM)) ){
    pIter->flags |= FTS5_SEGITER_ONETERM;
    if( pIter->pLeaf ){
      if( flags & FTS5INDEX_QUERY_DESC ){
        pIter->flags |= FTS5_SEGITER_REVERSE;
      }
      if( bDlidx ){
        fts5SegIterLoadDlidx(p, pIter);
      }
      if( flags & FTS5INDEX_QUERY_DESC ){
        fts5SegIterReverse(p, pIter);
      }
    }
  }

  fts5SegIterSetNext(p, pIter);
  if( 0==(flags & FTS5INDEX_QUERY_SCANONETERM) ){
    fts5SegIterAllocTombstone(p, pIter);
  }

  /* Either:
  **
  **   1) an error has occurred, or
  **   2) the iterator points to EOF, or
  **   3) the iterator points to an entry with term (pTerm/nTerm), or
  **   4) the FTS5INDEX_QUERY_SCAN flag was set and the iterator points
  **      to an entry with a term greater than or equal to (pTerm/nTerm).
  */
  assert_nc( p->rc!=SQLITE_OK                                       /* 1 */
   || pIter->pLeaf==0                                               /* 2 */
   || fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)==0          /* 3 */
   || (bGe && fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)>0)  /* 4 */
  );
}